

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_align_search.c
# Opt level: O1

int state_align_search_step(ps_search_t *search,int frame_idx)

{
  int iVar1;
  uint uVar2;
  acmod_t *acmod;
  char *pcVar3;
  ps_searchfuncs_t *ppVar4;
  int iVar5;
  int32 iVar6;
  _func_int_ps_search_t_ptr *p_Var7;
  dict2pid_t *pdVar8;
  char *pcVar9;
  int *piVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int local_2c;
  
  acmod = search->acmod;
  local_2c = frame_idx;
  if (0 < *(int *)&search[1].acmod) {
    lVar16 = 0;
    lVar15 = 0;
    do {
      if (*(int *)(search[1].name + lVar16 + 0x4c) == local_2c) {
        acmod_activate_hmm(acmod,(hmm_t *)(search[1].name + lVar16));
      }
      lVar15 = lVar15 + 1;
      lVar16 = lVar16 + 0x58;
    } while (lVar15 < *(int *)&search[1].acmod);
  }
  p_Var7 = (_func_int_ps_search_t_ptr *)acmod_score(acmod,&local_2c);
  if ((*(int *)&search[1].dict < -0x1fd00000) &&
     (err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
              ,0xc1,"Renormalizing Scores at frame %d, best score %d\n"),
     0 < *(int *)&search[1].acmod)) {
    iVar6 = *(int32 *)&search[1].dict;
    lVar16 = 0;
    lVar15 = 0;
    do {
      hmm_normalize((hmm_t *)(search[1].name + lVar16),iVar6);
      lVar15 = lVar15 + 1;
      lVar16 = lVar16 + 0x58;
    } while (lVar15 < *(int *)&search[1].acmod);
  }
  iVar1 = local_2c;
  (search[1].vt)->finish = p_Var7;
  if (*(int *)&search[1].acmod < 1) {
    iVar12 = -0x20000000;
  }
  else {
    iVar12 = -0x20000000;
    lVar16 = 0;
    lVar15 = 0;
    do {
      if ((iVar1 <= *(int *)(search[1].name + lVar16 + 0x4c)) &&
         (iVar6 = hmm_vit_eval((hmm_t *)(search[1].name + lVar16)), iVar12 < iVar6)) {
        iVar12 = iVar6;
      }
      lVar15 = lVar15 + 1;
      lVar16 = lVar16 + 0x58;
    } while (lVar15 < *(int *)&search[1].acmod);
  }
  iVar5 = local_2c;
  *(int *)&search[1].dict = iVar12;
  iVar1 = *(int *)&search[1].acmod;
  if (0 < (long)iVar1) {
    piVar10 = (int *)(search[1].name + 0x4c);
    lVar15 = 0;
    do {
      if ((local_2c <= *piVar10) && (local_2c < (&(search[1].config)->refcount)[lVar15])) {
        *piVar10 = local_2c + 1;
      }
      lVar15 = lVar15 + 1;
      piVar10 = piVar10 + 0x16;
    } while (iVar1 != lVar15);
  }
  if (1 < iVar1) {
    iVar1 = local_2c + 1;
    lVar16 = 0x58;
    lVar15 = 0;
    do {
      pcVar9 = search[1].name;
      if (((*(int *)(pcVar9 + lVar16 + -0xc) == iVar1) &&
          (*(int *)((long)&(search[1].pls)->vt + lVar15 * 4 + 4) <= iVar1)) &&
         ((*(int *)(pcVar9 + lVar16 + 0x4c) < iVar5 ||
          (*(int *)(pcVar9 + lVar16 + 8) < *(int32 *)(pcVar9 + lVar16 + -0x28))))) {
        hmm_enter((hmm_t *)(pcVar9 + lVar16),*(int32 *)(pcVar9 + lVar16 + -0x28),
                  *(int32 *)(pcVar9 + lVar16 + -0x24),iVar1);
      }
      lVar15 = lVar15 + 1;
      lVar16 = lVar16 + 0x58;
    } while (lVar15 < (long)*(int *)&search[1].acmod + -1);
  }
  iVar1 = local_2c;
  lVar15 = (long)local_2c;
  if (*(int *)&search[1].hyp_str <= local_2c) {
    *(int *)&search[1].hyp_str = (int)(lVar15 + 0x15);
    pdVar8 = (dict2pid_t *)
             __ckd_realloc__(search[1].d2p,
                             (long)*(int *)((long)&search[1].dict + 4) * (lVar15 + 0x15) * 8,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                             ,0x8d);
    search[1].d2p = pdVar8;
  }
  lVar16 = (long)*(int *)((long)&search[1].dict + 4);
  memset(&(search[1].d2p)->refcount + lVar16 * lVar15 * 2,0xff,lVar16 << 3);
  if (0 < *(int *)&search[1].acmod) {
    lVar15 = *(int *)((long)&search[1].dict + 4) * lVar15;
    pdVar8 = search[1].d2p;
    pcVar3 = search[1].name;
    pcVar9 = pcVar3 + 0x1c;
    lVar16 = 0;
    do {
      if (iVar1 <= *(int *)(pcVar3 + lVar16 * 0x58 + 0x4c)) {
        ppVar4 = search[1].vt;
        uVar2 = *(uint *)&ppVar4->start;
        uVar14 = (ulong)uVar2;
        if (0 < (int)uVar2) {
          lVar11 = 0;
          do {
            iVar12 = (int)uVar14 * (int)lVar16;
            lVar13 = iVar12 + lVar11;
            (&pdVar8->refcount)[lVar15 * 2 + lVar13 * 2] = *(int *)(pcVar9 + lVar11 * 4);
            *(undefined4 *)(&pdVar8->field_0x4 + lVar13 * 8 + lVar15 * 8) =
                 *(undefined4 *)(pcVar9 + lVar11 * 4 + -0x14);
            *(int *)(pcVar9 + lVar11 * 4) = (int)lVar11 + iVar12;
            lVar11 = lVar11 + 1;
            uVar14 = (ulong)*(int *)&ppVar4->start;
          } while (lVar11 < (long)uVar14);
        }
      }
      lVar16 = lVar16 + 1;
      pcVar9 = pcVar9 + 0x58;
    } while (lVar16 < *(int *)&search[1].acmod);
  }
  *(int *)((long)&search[1].acmod + 4) = local_2c;
  return 0;
}

Assistant:

static int
state_align_search_step(ps_search_t *search, int frame_idx)
{
    state_align_search_t *sas = (state_align_search_t *)search;
    acmod_t *acmod = ps_search_acmod(search);
    int16 const *senscr;
    int i;

    /* Calculate senone scores. */
    for (i = 0; i < sas->n_phones; ++i)
        if (hmm_frame(&sas->hmms[i]) == frame_idx)
            acmod_activate_hmm(acmod, &sas->hmms[i]);
    senscr = acmod_score(acmod, &frame_idx);

    /* Renormalize here if needed. */
    /* FIXME: Make sure to (unit-)test this!!! */
    if ((sas->best_score - 0x300000) WORSE_THAN WORST_SCORE) {
        E_INFO("Renormalizing Scores at frame %d, best score %d\n",
               frame_idx, sas->best_score);
        renormalize_hmms(sas, frame_idx, sas->best_score);
    }

    /* Viterbi step. */
    sas->best_score = evaluate_hmms(sas, senscr, frame_idx);
    prune_hmms(sas, frame_idx);

    /* Transition out of non-emitting states. */
    phone_transition(sas, frame_idx);

    /* Generate new tokens from best path results. */
    record_transitions(sas, frame_idx);

    /* Update frame counter */
    sas->frame = frame_idx;

    return 0;
}